

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O1

char * deqp::gles3::Functional::UniformInfoQueryCase::getCaseTypeName(CaseType caseType)

{
  if (caseType < CASETYPE_LAST) {
    return *(char **)(&DAT_00d2fc38 + (ulong)caseType * 8);
  }
  return (char *)0x0;
}

Assistant:

const char* UniformInfoQueryCase::getCaseTypeName (const CaseType caseType)
{
	switch (caseType)
	{
		case CASETYPE_UNIFORM:				return "active_uniform";
		case CASETYPE_INDICES_UNIFORMSIV:	return "indices_active_uniformsiv";
		case CASETYPE_CONSISTENCY:			return "consistency";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}